

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

bool __thiscall
jsoncons::jsonpath::detail::
token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::is_path(token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          *this)

{
  undefined1 uVar1;
  assertion_error *this_00;
  allocator<char> local_31;
  string local_30;
  
  if (this->token_kind_ == selector) {
    if ((this->field_1).selector_ == (selector_type *)0x0) {
      this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"assertion \'selector_ != nullptr\' failed at  <> :0",&local_31
                );
      assertion_error::assertion_error(this_00,&local_30);
      __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = ((this->field_1).selector_)->is_path_;
  }
  else {
    uVar1 = 0;
  }
  return (bool)uVar1;
}

Assistant:

bool is_path() const
        {
            if (token_kind_ == jsonpath_token_kind::selector)
            {
                JSONCONS_ASSERT(selector_ != nullptr);
                return selector_->is_path(); 
            }
            return false;
        }